

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

uint32_t FastLog2Slow_C(uint32_t v)

{
  int iVar1;
  int64_t iVar2;
  byte bVar3;
  uint in_EDI;
  double dVar4;
  uint64_t correction;
  uint32_t y;
  uint32_t log_cnt;
  uint32_t log_2;
  uint32_t orig_v;
  uint32_t local_10;
  uint32_t local_4;
  
  if (in_EDI < 0x10000) {
    iVar1 = BitsLog2Floor(in_EDI);
    bVar3 = (byte)(iVar1 + -7);
    local_10 = kLog2Table[in_EDI >> (bVar3 & 0x1f)] + (iVar1 + -7) * 0x800000;
    if (0xfff < in_EDI) {
      iVar2 = DivRound((ulong)(in_EDI & (1 << (bVar3 & 0x1f)) - 1U) * 0xb8aa3b,(ulong)in_EDI);
      local_10 = (int)iVar2 + local_10;
    }
    local_4 = local_10;
  }
  else {
    dVar4 = log((double)in_EDI);
    local_4 = (uint32_t)(long)(dVar4 * 12102203.161561485 + 0.5);
  }
  return local_4;
}

Assistant:

static uint32_t FastLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
    const uint32_t orig_v = v;
    uint32_t log_2;
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const uint32_t log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    v >>= log_cnt;
#else
    uint32_t log_cnt = 0;
    uint32_t y = 1;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    log_2 = kLog2Table[v] + (log_cnt << LOG_2_PRECISION_BITS);
    if (orig_v >= APPROX_LOG_MAX) {
      // Since the division is still expensive, add this correction factor only
      // for large values of 'v'.
      const uint64_t correction = LOG_2_RECIPROCAL_FIXED * (orig_v & (y - 1));
      log_2 += (uint32_t)DivRound(correction, orig_v);
    }
    return log_2;
  } else {
    return (uint32_t)(LOG_2_RECIPROCAL_FIXED_DOUBLE * log((double)v) + .5);
  }
}